

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O1

void __thiscall
cmCTestMemCheckHandler::TestOutputFileNames
          (cmCTestMemCheckHandler *this,int test,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files)

{
  pointer pcVar1;
  pointer pbVar2;
  pointer pbVar3;
  cmCTest *pcVar4;
  bool bVar5;
  ulong uVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar7;
  ostream *poVar8;
  string ofile;
  string log;
  string index;
  Glob g;
  ostringstream cmCTestLog_msg;
  ostringstream stream;
  string local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  undefined1 *local_3b8;
  undefined8 local_3b0;
  undefined1 local_3a8;
  undefined7 uStack_3a7;
  long *local_398;
  long local_388 [2];
  undefined1 local_378 [16];
  GlobInternals local_368;
  undefined1 local_320 [16];
  _func_int *local_310 [12];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_3b0 = 0;
  local_3a8 = 0;
  local_3b8 = &local_3a8;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::ostream::operator<<(local_1a8,test);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_3b8,(string *)local_320);
  if ((_func_int **)local_320._0_8_ != local_310) {
    operator_delete((void *)local_320._0_8_,(ulong)(local_310[0] + 1));
  }
  local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
  pcVar1 = (this->MemoryTesterOutputFile)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3f8,pcVar1,pcVar1 + (this->MemoryTesterOutputFile)._M_string_length);
  uVar6 = std::__cxx11::string::find((char *)&local_3f8,0x6057a8,0);
  std::__cxx11::string::replace((ulong)&local_3f8,uVar6,(char *)0x2,(ulong)local_3b8);
  if (this->LogWithPID == true) {
    std::__cxx11::string::append((char *)&local_3f8);
    cmsys::Glob::Glob((Glob *)local_378);
    cmsys::Glob::FindFiles((Glob *)local_378,&local_3f8,(GlobMessages *)0x0);
    pvVar7 = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)local_378);
    pbVar2 = (pvVar7->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar3 = (pvVar7->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar2 == pbVar3) {
      std::operator+(&local_3d8,"Cannot find memory tester output file: ",&local_3f8);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_320,local_3d8._M_dataplus._M_p,local_3d8._M_string_length
                         );
      std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      pcVar4 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestMemCheckHandler.cxx"
                   ,0x442,(char *)local_398,false);
      if (local_398 != local_388) {
        operator_delete(local_398,local_388[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
      std::ios_base::~ios_base(local_2b0);
      local_3f8._M_string_length = 0;
      *local_3f8._M_dataplus._M_p = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
        operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      pvVar7 = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)local_378);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(files,pvVar7);
    }
    cmsys::Glob::~Glob((Glob *)local_378);
    if (pbVar2 != pbVar3) goto LAB_00195c74;
  }
  else {
    bVar5 = cmsys::SystemTools::FileExists(&local_3f8);
    if (!bVar5) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378,
                     "Cannot find memory tester output file: ",&local_3f8);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_320,(char *)local_378._0_8_,local_378._8_8_);
      std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      pcVar4 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestMemCheckHandler.cxx"
                   ,0x44a,local_3d8._M_dataplus._M_p,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
        operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
      std::ios_base::~ios_base(local_2b0);
      local_3f8._M_string_length = 0;
      *local_3f8._M_dataplus._M_p = '\0';
      if ((GlobInternals *)local_378._0_8_ != &local_368) {
        operator_delete((void *)local_378._0_8_,
                        (ulong)((long)local_368.Files.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1));
      }
    }
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)files,&local_3f8);
LAB_00195c74:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  if (local_3b8 != &local_3a8) {
    operator_delete(local_3b8,CONCAT71(uStack_3a7,local_3a8) + 1);
  }
  return;
}

Assistant:

void cmCTestMemCheckHandler::TestOutputFileNames(
  int test, std::vector<std::string>& files)
{
  std::string index;
  std::ostringstream stream;
  stream << test;
  index = stream.str();
  std::string ofile = this->MemoryTesterOutputFile;
  std::string::size_type pos = ofile.find("??");
  ofile.replace(pos, 2, index);
  if (this->LogWithPID) {
    ofile += ".*";
    cmsys::Glob g;
    g.FindFiles(ofile);
    if (g.GetFiles().empty()) {
      std::string log = "Cannot find memory tester output file: " + ofile;
      cmCTestLog(this->CTest, WARNING, log << std::endl);
      ofile.clear();
    } else {
      files = g.GetFiles();
      return;
    }
  } else if (!cmSystemTools::FileExists(ofile)) {
    std::string log = "Cannot find memory tester output file: " + ofile;
    cmCTestLog(this->CTest, WARNING, log << std::endl);
    ofile.clear();
  }
  files.push_back(std::move(ofile));
}